

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O0

void cppcms::forward_connection(shared_ptr<cppcms::http::context> *con,string *ip,int port)

{
  connection *pcVar1;
  shared_ptr<cppcms::http::context> *this;
  pair<void_*,_unsigned_long> pVar2;
  shared_ptr<cppcms::impl::tcp_pipe> pipe;
  size_t in_stack_00000050;
  string header;
  pair<void_*,_unsigned_long> post;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *env;
  tcp_pipe *__p;
  request *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  tcp_pipe *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  tcp_pipe *this_00;
  
  std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x42b818);
  pcVar1 = http::context::connection((context *)0x42b820);
  (*pcVar1->_vptr_connection[2])();
  std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x42b83e);
  http::context::request((context *)0x42b846);
  pVar2 = http::request::raw_post_data(in_stack_ffffffffffffff60);
  this_00 = (tcp_pipe *)pVar2.first;
  impl::make_scgi_header
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)header._0_8_,in_stack_00000050);
  std::__cxx11::string::append(&stack0xffffffffffffffb0,(ulong)this_00);
  this = (shared_ptr<cppcms::http::context> *)operator_new(0xb0);
  __p = (tcp_pipe *)&stack0xffffffffffffff80;
  std::shared_ptr<cppcms::http::context>::shared_ptr(this,(shared_ptr<cppcms::http::context> *)__p);
  impl::tcp_pipe::tcp_pipe
            (in_stack_ffffffffffffffc0,
             (shared_ptr<cppcms::http::context> *)in_stack_ffffffffffffffb8,
             (string *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  std::shared_ptr<cppcms::impl::tcp_pipe>::shared_ptr<cppcms::impl::tcp_pipe,void>
            ((shared_ptr<cppcms::impl::tcp_pipe> *)this,__p);
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x42b8fb)
  ;
  std::__shared_ptr_access<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x42b905);
  impl::tcp_pipe::async_send_receive(this_00,in_stack_ffffffffffffffc8);
  std::shared_ptr<cppcms::impl::tcp_pipe>::~shared_ptr
            ((shared_ptr<cppcms::impl::tcp_pipe> *)0x42b91e);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

void forward_connection(booster::shared_ptr<http::context> con,std::string const &ip,int port)
	{

		std::map<std::string,std::string> const &env = con->connection().getenv();
		std::pair<void *,size_t> post = con->request().raw_post_data();
		std::string header = impl::make_scgi_header(env,post.second);
		header.append(reinterpret_cast<char *>(post.first),post.second);
		
		booster::shared_ptr<impl::tcp_pipe> pipe(new impl::tcp_pipe(con,ip,port));
		pipe->async_send_receive(header);
	}